

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O3

void cache_free(void)

{
  munmap(cache_table,cache_max * 0x20 + 0x3f & 0xffffffffffffffc0);
  munmap(cache_status,cache_max * 4 + 0x3f & 0xffffffffffffffc0);
  return;
}

Assistant:

void
cache_free()
{
    free_aligned(cache_table, cache_max * sizeof(struct cache_entry));
    free_aligned(cache_status, cache_max * sizeof(uint32_t));
}